

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  undefined1 *puVar1;
  ptls_esni_secret_t **esni;
  ushort *end;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ptls_key_schedule_t *ppVar5;
  ptls_context_t *ppVar6;
  size_t *psVar7;
  ptls_buffer_t *buf;
  ptls_buffer_t *buf_00;
  st_ptls_update_esni_key_t *psVar8;
  st_ptls_key_exchange_algorithm_t *psVar9;
  ptls_iovec_t *ppVar10;
  ptls_key_exchange_algorithm_t *ppVar11;
  ptls_hash_algorithm_t *algo;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ptls_iovec_t hash_value;
  ptls_iovec_t pVar15;
  int iVar16;
  ptls_early_data_acceptance_t pVar17;
  uint uVar18;
  ptls_esni_secret_t *ppVar19;
  ptls_cipher_suite_t **pppVar20;
  uint8_t *puVar21;
  undefined1 *puVar22;
  ptls_key_schedule_t *ppVar23;
  ptls_hash_context_t *ppVar24;
  char *server_name;
  uint64_t uVar25;
  ptls_key_exchange_context_t **pppVar26;
  size_t sVar27;
  ptls_cipher_suite_t *ppVar28;
  ptls_key_exchange_algorithm_t **pppVar29;
  size_t sVar30;
  size_t sVar31;
  long lVar32;
  size_t len;
  uint8_t *puVar33;
  char *server_name_00;
  size_t sVar34;
  uint16_t *puVar35;
  ptls_hash_context_t **pppVar36;
  uint8_t *in_R9;
  ushort *puVar37;
  uint16_t uVar38;
  ulong uVar39;
  size_t sVar40;
  ushort *puVar41;
  size_t sVar42;
  ushort *puVar43;
  bool bVar44;
  ptls_iovec_t secret;
  ptls_iovec_t ikm;
  ptls_iovec_t esni_keys;
  size_t in_stack_fffffffffffffec8;
  uint32_t _v;
  uint8_t *local_118;
  ulong local_108;
  ushort *local_100;
  ushort *local_e8;
  size_t local_e0;
  ptls_buffer_t *local_d8;
  ulong local_d0;
  ptls_iovec_t *local_c8;
  anon_struct_104_5_dae46d3e_for_client *local_c0;
  ptls_esni_secret_t *local_b8;
  ptls_key_exchange_context_t **local_b0;
  uint64_t not_before;
  uint32_t max_early_data_size;
  uint32_t age_add;
  ptls_iovec_t resumption_ticket;
  uint64_t not_after;
  size_t local_80;
  uint8_t binder_key [64];
  
  ppVar5 = tls->key_schedule;
  if (tls->server_name == (char *)0x0) {
    bVar44 = false;
  }
  else {
    iVar16 = ptls_server_name_is_ipaddr(tls->server_name);
    bVar44 = iVar16 == 0;
  }
  if (properties == (ptls_handshake_properties_t *)0x0) {
    uVar18 = 0;
    server_name = (char *)0x0;
    uVar39 = 0;
    local_100 = (ushort *)0x0;
    local_c8 = cookie;
    if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
LAB_00109885:
      tls->key_share = *tls->ctx->key_exchanges;
    }
    goto LAB_00109896;
  }
  if ((!(bool)(ppVar5 == (ptls_key_schedule_t *)0x0 & bVar44)) ||
     (puVar41 = (ushort *)(properties->field_0).client.esni_keys.base, puVar41 == (ushort *)0x0)) {
    server_name = (char *)0x0;
    goto LAB_00109748;
  }
  ppVar6 = tls->ctx;
  uVar39 = (properties->field_0).client.esni_keys.len;
  ppVar19 = (ptls_esni_secret_t *)calloc(1,0xd0);
  tls->esni = ppVar19;
  if (ppVar19 != (ptls_esni_secret_t *)0x0) {
    esni = &tls->esni;
    if (((1 < (long)uVar39) && ((ushort)(*puVar41 << 8 | *puVar41 >> 8) == 0xff02)) && (5 < uVar39))
    {
      pppVar20 = ppVar6->cipher_suites;
      ppVar28 = *pppVar20;
      if (ppVar28 != (ptls_cipher_suite_t *)0x0) {
        local_d8 = (ptls_buffer_t *)tls->client_random;
        local_c0 = &ppVar19->client;
        end = (ushort *)((long)puVar41 + uVar39);
        do {
          pppVar20 = pppVar20 + 1;
          if ((ppVar28->id | 2) == 0x1303) {
            local_d0 = uVar39;
            local_b8 = ppVar19;
            ppVar24 = (*ppVar28->hash->create)();
            if (ppVar24 != (ptls_hash_context_t *)0x0) {
              (*ppVar24->update)(ppVar24,puVar41,2);
              (*ppVar24->update)(ppVar24,"",4);
              uVar39 = local_d0 - 6;
              (*ppVar24->update)(ppVar24,puVar41 + 3);
              (*ppVar24->final)(ppVar24,binder_key,PTLS_HASH_FINAL_MODE_FREE);
              if (((*(int *)(puVar41 + 1) == binder_key._0_4_) &&
                  (local_b8->version = 0xff02, 1 < uVar39)) &&
                 (uVar39 = (ulong)(ushort)(puVar41[3] << 8 | puVar41[3] >> 8),
                 uVar39 <= local_d0 - 8)) {
                server_name = (char *)malloc(uVar39 + 1);
                if (server_name == (char *)0x0) {
                  server_name = (char *)0x0;
                  goto LAB_00109dfd;
                }
                puVar37 = (ushort *)((long)(puVar41 + 4) + uVar39);
                if (uVar39 != 0) {
                  memcpy(server_name,puVar41 + 4,uVar39);
                }
                server_name[uVar39] = '\0';
                if ((ulong)((long)end - (long)puVar37) < 2) goto LAB_00109dfd;
                uVar39 = (ulong)(ushort)(*puVar37 << 8 | *puVar37 >> 8);
                local_e8 = puVar37 + 1;
                if ((ulong)((long)end - (long)local_e8) < uVar39) goto LAB_00109dfd;
                puVar37 = (ushort *)((long)local_e8 + uVar39);
                in_R9 = (uint8_t *)0x0;
                iVar16 = select_key_share(&local_c0->key_share,&resumption_ticket,
                                          ppVar6->key_exchanges,(uint8_t **)&local_e8,
                                          (uint8_t *)puVar37,0);
                if (((iVar16 != 0) || (local_e8 != puVar37)) ||
                   ((ulong)((long)end - (long)puVar37) < 2)) goto LAB_00109dfd;
                uVar39 = (ulong)(ushort)(*local_e8 << 8 | *local_e8 >> 8);
                puVar37 = local_e8 + 1;
                if ((ulong)((long)end - (long)puVar37) < uVar39) goto LAB_00109dfd;
                puVar43 = (ushort *)(uVar39 + (long)puVar37);
                iVar16 = select_cipher(&(ppVar19->client).cipher,ppVar6->cipher_suites,
                                       (uint8_t *)puVar37,(uint8_t *)puVar43,
                                       *(uint *)&ppVar6->field_0x70 >> 6 & 1);
                if ((iVar16 != 0) || ((long)end - (long)puVar43 < 2)) goto LAB_00109dfd;
                (local_b8->client).padded_length = *puVar43 << 8 | *puVar43 >> 8;
                local_e8 = puVar43 + 1;
                iVar16 = ptls_decode64(&not_before,(uint8_t **)&local_e8,(uint8_t *)end);
                if ((iVar16 != 0) ||
                   ((iVar16 = ptls_decode64(&not_after,(uint8_t **)&local_e8,(uint8_t *)end),
                    iVar16 != 0 || ((ulong)((long)end - (long)local_e8) < 2)))) goto LAB_00109dfd;
                uVar39 = (ulong)(ushort)(*local_e8 << 8 | *local_e8 >> 8);
                puVar37 = local_e8 + 1;
                if ((ulong)((long)end - (long)puVar37) < uVar39) goto LAB_00109dfd;
                puVar43 = puVar37;
                if (uVar39 == 0) goto LAB_0010a15b;
                puVar43 = (ushort *)(uVar39 + (long)puVar37);
                goto LAB_0010a114;
              }
            }
            break;
          }
          ppVar28 = *pppVar20;
        } while (ppVar28 != (ptls_cipher_suite_t *)0x0);
      }
    }
    server_name = (char *)0x0;
    goto LAB_00109dfd;
  }
  iVar16 = 0x201;
  server_name = (char *)0x0;
LAB_00109c1d:
  if (server_name == (char *)0x0) goto LAB_00109c2a;
  goto LAB_00109c22;
joined_r0x00109e6a:
  if (ppVar28 == (ptls_cipher_suite_t *)0x0) goto LAB_001097f1;
  pppVar20 = pppVar20 + 1;
  if (ppVar28->id == (uint16_t)(uVar4 << 8 | uVar4 >> 8)) {
    uVar25 = (*ppVar6->get_time->cb)(ppVar6->get_time);
    if ((not_before <= uVar25) && (uVar25 - not_before < 0x240c8400)) {
      bVar2 = (tls->field_18).server.pending_traffic_secret[0x38];
      uVar18 = (int)(uVar25 - not_before) + age_add;
      (tls->field_18).server.pending_traffic_secret[0x38] = bVar2 | 1;
      if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
        tls->key_share = ppVar11;
      }
      tls->cipher_suite = ppVar28;
      if ((max_early_data_size != 0 && ppVar5 == (ptls_key_schedule_t *)0x0) &&
         ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
        (tls->field_18).server.pending_traffic_secret[0x38] = bVar2 | 3;
        *(properties->field_0).client.max_early_data_size = (ulong)max_early_data_size;
      }
      goto LAB_0010984a;
    }
    goto LAB_001097f1;
  }
  ppVar28 = *pppVar20;
  goto joined_r0x00109e6a;
  while( true ) {
    uVar39 = (ulong)(ushort)(puVar37[1] << 8 | puVar37[1] >> 8);
    if ((ulong)((long)puVar43 - (long)(puVar37 + 2)) < uVar39) goto LAB_00109dfd;
    puVar37 = (ushort *)((long)(puVar37 + 2) + uVar39);
    if (puVar37 == puVar43) break;
LAB_0010a114:
    if (((long)puVar43 - (long)puVar37 < 2) || (((long)puVar43 - (long)puVar37) - 2U < 2))
    goto LAB_00109dfd;
  }
LAB_0010a15b:
  if (((puVar43 == end) &&
      (uVar25 = (*ppVar6->get_time->cb)(ppVar6->get_time),
      not_before * 1000 < uVar25 || not_before * 1000 - uVar25 == 0)) &&
     (uVar25 <= not_after * 1000)) {
    (*ppVar6->random_bytes)((*esni)->nonce,0x10);
    ppVar19 = *esni;
    ppVar24 = (*((ppVar19->client).cipher)->hash->create)();
    if (ppVar24 == (ptls_hash_context_t *)0x0) {
      iVar16 = 0x201;
    }
    else {
      (*ppVar24->update)(ppVar24,puVar41,local_d0);
      (*ppVar24->final)(ppVar24,(ppVar19->client).record_digest,PTLS_HASH_FINAL_MODE_FREE);
      ppVar19 = *esni;
      psVar9 = (ppVar19->client).key_share;
      pVar15.len = resumption_ticket.len;
      pVar15.base = resumption_ticket.base;
      iVar16 = (*psVar9->exchange)(psVar9,&(ppVar19->client).pubkey,&ppVar19->secret,pVar15);
      if (iVar16 == 0) {
        ppVar19 = *esni;
        in_R9 = (uint8_t *)(ppVar19->client).pubkey.len;
        iVar16 = build_esni_contents_hash
                           (((ppVar19->client).cipher)->hash,ppVar19->esni_contents_hash,
                            (ppVar19->client).record_digest,((ppVar19->client).key_share)->id,
                            (ppVar19->client).pubkey,(uint8_t *)local_d8);
        if (iVar16 == 0) goto LAB_00109e10;
      }
    }
    free_esni_secret(esni,0);
    goto LAB_00109c1d;
  }
LAB_00109dfd:
  free(*esni);
  *esni = (ptls_esni_secret_t *)0x0;
LAB_00109e10:
  psVar8 = tls->ctx->update_esni_key;
  if (psVar8 != (st_ptls_update_esni_key_t *)0x0) {
    ppVar19 = tls->esni;
    in_R9 = ppVar19->esni_contents_hash;
    iVar16 = (*psVar8->cb)(psVar8,tls,ppVar19->secret,((ppVar19->client).cipher)->hash,in_R9);
    if (iVar16 != 0) goto LAB_00109c1d;
  }
LAB_00109748:
  uVar18 = 0;
  puVar41 = (ushort *)(properties->field_0).client.session_ticket.base;
  if (puVar41 == (ushort *)0x0) {
    uVar39 = 0;
    local_100 = (ushort *)0x0;
    local_c8 = cookie;
  }
  else {
    puVar33 = (uint8_t *)((properties->field_0).client.session_ticket.len + (long)puVar41);
    local_e8 = puVar41;
    local_c8 = cookie;
    iVar16 = ptls_decode64(&not_before,(uint8_t **)&local_e8,puVar33);
    if (((iVar16 == 0) && (1 < (long)puVar33 - (long)local_e8)) &&
       ((1 < ((long)puVar33 - (long)local_e8) + -2 &&
        (2 < (ulong)((long)puVar33 - (long)(local_e8 + 2)))))) {
      uVar3 = *local_e8;
      uVar4 = local_e8[1];
      lVar32 = 0;
      uVar39 = 0;
      do {
        uVar39 = (ulong)*(byte *)((long)(local_e8 + 2) + lVar32) | uVar39 << 8;
        lVar32 = lVar32 + 1;
      } while (lVar32 != 3);
      puVar21 = (uint8_t *)((long)local_e8 + 7);
      if (uVar39 <= (ulong)((long)puVar33 - (long)puVar21)) {
        puVar41 = (ushort *)(puVar21 + uVar39);
        in_R9 = (uint8_t *)&max_early_data_size;
        iVar16 = decode_new_session_ticket
                           (tls,(uint32_t *)&not_after,&age_add,(ptls_iovec_t *)binder_key,
                            &resumption_ticket,(uint32_t *)in_R9,puVar21,(uint8_t *)puVar41);
        if ((1 < (ulong)((long)puVar33 - (long)puVar41)) && (iVar16 == 0)) {
          uVar39 = (ulong)(ushort)(*puVar41 << 8 | *puVar41 >> 8);
          local_100 = puVar41 + 1;
          if ((uint8_t *)((long)puVar41 + uVar39 + 2) == puVar33 &&
              uVar39 <= (ulong)((long)puVar33 - (long)local_100)) {
            ppVar6 = tls->ctx;
            pppVar29 = ppVar6->key_exchanges;
            ppVar11 = *pppVar29;
            while (ppVar11 != (ptls_key_exchange_algorithm_t *)0x0) {
              pppVar29 = pppVar29 + 1;
              if (ppVar11->id == (uint16_t)(uVar3 << 8 | uVar3 >> 8)) {
                pppVar20 = ppVar6->cipher_suites;
                ppVar28 = *pppVar20;
                goto joined_r0x00109e6a;
              }
              ppVar11 = *pppVar29;
            }
          }
        }
      }
    }
LAB_001097f1:
    uVar18 = 0;
    uVar39 = 0;
    local_100 = (ushort *)0x0;
  }
LAB_0010984a:
  pVar17 = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
  if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
    psVar7 = (properties->field_0).client.max_early_data_size;
    pVar17 = PTLS_EARLY_DATA_REJECTED;
    if (psVar7 != (size_t *)0x0) {
      *psVar7 = 0;
    }
  }
  (properties->field_0).client.early_data_acceptance = pVar17;
  if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) &&
     (((properties->field_0).server.selected_psk_binder.base[0x2c] & 1) == 0)) goto LAB_00109885;
LAB_00109896:
  if (ppVar5 == (ptls_key_schedule_t *)0x0) {
    ppVar23 = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                               tls->ctx->hkdf_label_prefix__obsolete);
    tls->key_schedule = ppVar23;
    ikm.len = uVar39;
    ikm.base = (uint8_t *)local_100;
    iVar16 = key_schedule_extract(ppVar23,ikm);
    if (iVar16 != 0) goto LAB_00109c1d;
  }
  sVar42 = emitter->record_header_length;
  sVar40 = emitter->buf->off;
  iVar16 = (*emitter->begin_message)(emitter);
  if (iVar16 != 0) goto LAB_00109c1d;
  buf = emitter->buf;
  local_d0 = sVar42 + sVar40;
  iVar16 = ptls_buffer_reserve(buf,1);
  if (iVar16 != 0) goto LAB_00109c1d;
  buf->base[buf->off] = '\x01';
  buf->off = buf->off + 1;
  iVar16 = ptls_buffer_reserve(buf,3);
  if (iVar16 != 0) goto LAB_00109c1d;
  puVar33 = buf->base;
  sVar42 = buf->off;
  puVar33[sVar42 + 2] = '\0';
  puVar33 = puVar33 + sVar42;
  puVar33[0] = '\0';
  puVar33[1] = '\0';
  local_c0 = (anon_struct_104_5_dae46d3e_for_client *)buf->off;
  local_b8 = (ptls_esni_secret_t *)((long)&local_c0->key_share + 3);
  buf->off = (size_t)local_b8;
  buf_00 = emitter->buf;
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 != 0) goto LAB_00109c1d;
  puVar33 = buf_00->base;
  sVar42 = buf_00->off;
  (puVar33 + sVar42)[0] = '\x03';
  (puVar33 + sVar42)[1] = '\x03';
  buf_00->off = buf_00->off + 2;
  iVar16 = ptls_buffer_reserve(buf_00,0x20);
  if (iVar16 != 0) goto LAB_00109c1d;
  puVar33 = buf_00->base;
  sVar42 = buf_00->off;
  uVar12 = *(undefined8 *)tls->client_random;
  uVar13 = *(undefined8 *)(tls->client_random + 8);
  uVar14 = *(undefined8 *)(tls->client_random + 0x18);
  puVar21 = puVar33 + sVar42 + 0x10;
  *(undefined8 *)puVar21 = *(undefined8 *)(tls->client_random + 0x10);
  *(undefined8 *)(puVar21 + 8) = uVar14;
  puVar33 = puVar33 + sVar42;
  *(undefined8 *)puVar33 = uVar12;
  *(undefined8 *)(puVar33 + 8) = uVar13;
  buf_00->off = buf_00->off + 0x20;
  iVar16 = ptls_buffer_reserve(buf_00,1);
  if (iVar16 != 0) goto LAB_00109c1d;
  buf_00->base[buf_00->off] = '\0';
  sVar42 = buf_00->off;
  sVar40 = sVar42 + 1;
  buf_00->off = sVar40;
  iVar16 = ptls_buffer__do_pushv
                     (buf_00,(tls->field_18).client.legacy_session_id.base,
                      (tls->field_18).client.legacy_session_id.len);
  if (iVar16 != 0) goto LAB_00109c1d;
  buf_00->base[sVar42] = (char)(int)buf_00->off - (char)sVar40;
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 != 0) goto LAB_00109c1d;
  puVar33 = buf_00->base;
  sVar42 = buf_00->off;
  (puVar33 + sVar42)[0] = '\0';
  (puVar33 + sVar42)[1] = '\0';
  local_d8 = (ptls_buffer_t *)buf_00->off;
  puVar1 = (undefined1 *)((long)&local_d8->base + 2);
  buf_00->off = (size_t)puVar1;
  pppVar20 = tls->ctx->cipher_suites;
  ppVar28 = *pppVar20;
  puVar22 = puVar1;
  while (ppVar28 != (ptls_cipher_suite_t *)0x0) {
    pppVar20 = pppVar20 + 1;
    uVar3 = ppVar28->id;
    iVar16 = ptls_buffer_reserve(buf_00,2);
    if (iVar16 != 0) goto LAB_00109c1d;
    *(ushort *)(buf_00->base + buf_00->off) = uVar3 << 8 | uVar3 >> 8;
    puVar22 = (undefined1 *)(buf_00->off + 2);
    buf_00->off = (size_t)puVar22;
    ppVar28 = *pppVar20;
  }
  *(uint8_t *)((long)&local_d8->base + (long)buf_00->base) =
       (uint8_t)((ulong)((long)puVar22 - (long)puVar1) >> 8);
  *(uint8_t *)((long)&local_d8->base + (long)(buf_00->base + 1)) =
       (uint8_t)((long)puVar22 - (long)puVar1);
  iVar16 = ptls_buffer_reserve(buf_00,1);
  if (iVar16 != 0) goto LAB_00109c1d;
  buf_00->base[buf_00->off] = '\0';
  sVar42 = buf_00->off;
  buf_00->off = sVar42 + 1;
  local_d8 = buf;
  iVar16 = ptls_buffer_reserve(buf_00,1);
  if (iVar16 != 0) goto LAB_00109c1d;
  buf_00->base[buf_00->off] = '\0';
  sVar40 = buf_00->off;
  buf_00->off = sVar40 + 1;
  buf_00->base[sVar42] = (char)sVar40 - (char)sVar42;
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 != 0) goto LAB_00109c1d;
  puVar33 = buf_00->base;
  sVar42 = buf_00->off;
  (puVar33 + sVar42)[0] = '\0';
  (puVar33 + sVar42)[1] = '\0';
  sVar42 = buf_00->off;
  local_80 = sVar42 + 2;
  buf_00->off = local_80;
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 != 0) goto LAB_00109c1d;
  puVar33 = buf_00->base;
  sVar40 = buf_00->off;
  (puVar33 + sVar40)[0] = '\0';
  (puVar33 + sVar40)[1] = '3';
  buf_00->off = buf_00->off + 2;
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 != 0) goto LAB_00109c1d;
  puVar33 = buf_00->base;
  sVar40 = buf_00->off;
  (puVar33 + sVar40)[0] = '\0';
  (puVar33 + sVar40)[1] = '\0';
  sVar40 = buf_00->off;
  local_e0 = sVar40 + 2;
  buf_00->off = local_e0;
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 != 0) goto LAB_00109c1d;
  puVar33 = buf_00->base;
  sVar30 = buf_00->off;
  (puVar33 + sVar30)[0] = '\0';
  (puVar33 + sVar30)[1] = '\0';
  sVar27 = buf_00->off;
  sVar30 = sVar27 + 2;
  buf_00->off = sVar30;
  psVar9 = tls->key_share;
  sVar34 = sVar30;
  if (psVar9 != (st_ptls_key_exchange_algorithm_t *)0x0) {
    local_b0 = &(tls->field_18).client.key_share_ctx;
    iVar16 = (*psVar9->create)(psVar9,local_b0);
    if ((iVar16 != 0) ||
       (iVar16 = push_key_share_entry(buf_00,tls->key_share->id,(*local_b0)->pubkey), iVar16 != 0))
    goto LAB_00109c1d;
    sVar34 = buf_00->off;
  }
  buf_00->base[sVar27] = (uint8_t)(sVar34 - sVar30 >> 8);
  buf_00->base[sVar27 + 1] = (uint8_t)(sVar34 - sVar30);
  server_name_00 = (char *)(buf_00->off - local_e0);
  buf_00->base[sVar40] = (uint8_t)((ulong)server_name_00 >> 8);
  buf_00->base[sVar40 + 1] = (uint8_t)server_name_00;
  if (!bVar44) {
LAB_0010a41e:
    if (properties != (ptls_handshake_properties_t *)0x0) {
LAB_0010a42a:
      if ((properties->field_0).client.negotiated_protocols.count != 0) {
        iVar16 = ptls_buffer_reserve(buf_00,2);
        if (iVar16 == 0) {
          puVar33 = buf_00->base;
          sVar40 = buf_00->off;
          (puVar33 + sVar40)[0] = '\0';
          (puVar33 + sVar40)[1] = '\x10';
          buf_00->off = buf_00->off + 2;
          iVar16 = ptls_buffer_reserve(buf_00,2);
          if (iVar16 == 0) {
            puVar33 = buf_00->base;
            sVar40 = buf_00->off;
            (puVar33 + sVar40)[0] = '\0';
            (puVar33 + sVar40)[1] = '\0';
            sVar40 = buf_00->off;
            buf_00->off = sVar40 + 2;
            iVar16 = ptls_buffer_reserve(buf_00,2);
            if (iVar16 == 0) {
              puVar33 = buf_00->base;
              sVar30 = buf_00->off;
              (puVar33 + sVar30)[0] = '\0';
              (puVar33 + sVar30)[1] = '\0';
              local_e0 = buf_00->off;
              pppVar26 = (ptls_key_exchange_context_t **)(local_e0 + 2);
              buf_00->off = (size_t)pppVar26;
              local_b0 = pppVar26;
              if ((properties->field_0).client.negotiated_protocols.count != 0) {
                lVar32 = 8;
                sVar30 = 0;
                do {
                  iVar16 = ptls_buffer_reserve(buf_00,1);
                  if (iVar16 != 0) goto LAB_00109c1d;
                  buf_00->base[buf_00->off] = '\0';
                  sVar27 = buf_00->off;
                  sVar34 = sVar27 + 1;
                  buf_00->off = sVar34;
                  ppVar10 = (properties->field_0).client.negotiated_protocols.list;
                  iVar16 = ptls_buffer__do_pushv
                                     (buf_00,*(void **)((long)ppVar10 + lVar32 + -8),
                                      *(size_t *)((long)&ppVar10->base + lVar32));
                  if (iVar16 != 0) goto LAB_00109c1d;
                  buf_00->base[sVar27] = (char)(int)buf_00->off - (char)sVar34;
                  sVar30 = sVar30 + 1;
                  lVar32 = lVar32 + 0x10;
                } while (sVar30 != (properties->field_0).client.negotiated_protocols.count);
                pppVar26 = (ptls_key_exchange_context_t **)buf_00->off;
              }
              buf_00->base[local_e0] = (uint8_t)((ulong)((long)pppVar26 - (long)local_b0) >> 8);
              buf_00->base[local_e0 + 1] = (uint8_t)((long)pppVar26 - (long)local_b0);
              lVar32 = buf_00->off - (sVar40 + 2);
              buf_00->base[sVar40] = (uint8_t)((ulong)lVar32 >> 8);
              buf_00->base[sVar40 + 1] = (uint8_t)lVar32;
              goto LAB_0010a59e;
            }
          }
        }
        goto LAB_00109c1d;
      }
    }
LAB_0010a59e:
    if (tls->ctx->decompress_certificate == (ptls_decompress_certificate_t *)0x0) {
LAB_0010a6cb:
      iVar16 = ptls_buffer_reserve(buf_00,2);
      if (iVar16 == 0) {
        puVar33 = buf_00->base;
        sVar40 = buf_00->off;
        (puVar33 + sVar40)[0] = '\0';
        (puVar33 + sVar40)[1] = '+';
        buf_00->off = buf_00->off + 2;
        iVar16 = ptls_buffer_reserve(buf_00,2);
        if (iVar16 == 0) {
          puVar33 = buf_00->base;
          sVar40 = buf_00->off;
          (puVar33 + sVar40)[0] = '\0';
          (puVar33 + sVar40)[1] = '\0';
          sVar40 = buf_00->off;
          buf_00->off = sVar40 + 2;
          iVar16 = ptls_buffer_reserve(buf_00,1);
          if (iVar16 == 0) {
            buf_00->base[buf_00->off] = '\0';
            sVar30 = buf_00->off;
            sVar27 = sVar30 + 1;
            buf_00->off = sVar27;
            lVar32 = 0;
            do {
              uVar3 = *(ushort *)((long)supported_versions + lVar32);
              iVar16 = ptls_buffer_reserve(buf_00,2);
              if (iVar16 != 0) goto LAB_00109c1d;
              *(ushort *)(buf_00->base + buf_00->off) = uVar3 << 8 | uVar3 >> 8;
              sVar34 = buf_00->off + 2;
              buf_00->off = sVar34;
              lVar32 = lVar32 + 2;
            } while (lVar32 != 8);
            buf_00->base[sVar30] = (char)sVar34 - (char)sVar27;
            lVar32 = buf_00->off - (sVar40 + 2);
            buf_00->base[sVar40] = (uint8_t)((ulong)lVar32 >> 8);
            buf_00->base[sVar40 + 1] = (uint8_t)lVar32;
            iVar16 = ptls_buffer_reserve(buf_00,2);
            if (iVar16 == 0) {
              puVar33 = buf_00->base;
              sVar40 = buf_00->off;
              (puVar33 + sVar40)[0] = '\0';
              (puVar33 + sVar40)[1] = '\r';
              buf_00->off = buf_00->off + 2;
              iVar16 = ptls_buffer_reserve(buf_00,2);
              if (iVar16 == 0) {
                puVar33 = buf_00->base;
                sVar40 = buf_00->off;
                (puVar33 + sVar40)[0] = '\0';
                (puVar33 + sVar40)[1] = '\0';
                sVar40 = buf_00->off;
                buf_00->off = sVar40 + 2;
                iVar16 = push_signature_algorithms(tls->ctx->verify_certificate,buf_00);
                if (iVar16 == 0) {
                  lVar32 = buf_00->off - (sVar40 + 2);
                  buf_00->base[sVar40] = (uint8_t)((ulong)lVar32 >> 8);
                  buf_00->base[sVar40 + 1] = (uint8_t)lVar32;
                  iVar16 = ptls_buffer_reserve(buf_00,2);
                  if (iVar16 == 0) {
                    puVar33 = buf_00->base;
                    sVar40 = buf_00->off;
                    (puVar33 + sVar40)[0] = '\0';
                    (puVar33 + sVar40)[1] = '\n';
                    buf_00->off = buf_00->off + 2;
                    iVar16 = ptls_buffer_reserve(buf_00,2);
                    if (iVar16 == 0) {
                      puVar33 = buf_00->base;
                      sVar40 = buf_00->off;
                      (puVar33 + sVar40)[0] = '\0';
                      (puVar33 + sVar40)[1] = '\0';
                      sVar40 = buf_00->off;
                      buf_00->off = sVar40 + 2;
                      pppVar29 = tls->ctx->key_exchanges;
                      iVar16 = ptls_buffer_reserve(buf_00,2);
                      if (iVar16 == 0) {
                        puVar33 = buf_00->base;
                        sVar30 = buf_00->off;
                        (puVar33 + sVar30)[0] = '\0';
                        (puVar33 + sVar30)[1] = '\0';
                        sVar30 = buf_00->off;
                        sVar27 = sVar30 + 2;
                        buf_00->off = sVar27;
                        ppVar11 = *pppVar29;
                        local_e0 = sVar27;
                        while (ppVar11 != (ptls_key_exchange_algorithm_t *)0x0) {
                          pppVar29 = pppVar29 + 1;
                          uVar3 = ppVar11->id;
                          iVar16 = ptls_buffer_reserve(buf_00,2);
                          if (iVar16 != 0) goto LAB_00109c1d;
                          *(ushort *)(buf_00->base + buf_00->off) = uVar3 << 8 | uVar3 >> 8;
                          sVar27 = buf_00->off + 2;
                          buf_00->off = sVar27;
                          ppVar11 = *pppVar29;
                        }
                        buf_00->base[sVar30] = (uint8_t)(sVar27 - local_e0 >> 8);
                        buf_00->base[sVar30 + 1] = (uint8_t)(sVar27 - local_e0);
                        lVar32 = buf_00->off - (sVar40 + 2);
                        buf_00->base[sVar40] = (uint8_t)((ulong)lVar32 >> 8);
                        buf_00->base[sVar40 + 1] = (uint8_t)lVar32;
                        if ((local_c8 == (ptls_iovec_t *)0x0) || (local_c8->base == (uint8_t *)0x0))
                        {
LAB_0010aa6b:
                          if ((tls->ctx->field_0x70 & 0x20) == 0) {
LAB_0010aa78:
                            iVar16 = push_additional_extensions(properties,buf_00);
                            if (iVar16 == 0) {
                              if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0 &&
                                  local_100 == (ushort *)0x0) {
LAB_0010ade1:
                                lVar32 = buf_00->off - local_80;
                                buf_00->base[sVar42] = (uint8_t)((ulong)lVar32 >> 8);
                                buf_00->base[sVar42 + 1] = (uint8_t)lVar32;
                                sVar42 = local_d8->off;
                                lVar32 = 0x10;
                                do {
                                  local_c0->record_digest[(long)(local_d8->base + -0x20)] =
                                       (uint8_t)(sVar42 - (long)local_b8 >> ((byte)lVar32 & 0x3f));
                                  lVar32 = lVar32 + -8;
                                  local_c0 = (anon_struct_104_5_dae46d3e_for_client *)
                                             ((long)&local_c0->key_share + 1);
                                } while (lVar32 != -8);
                                iVar16 = (*emitter->commit_message)(emitter);
                                if (iVar16 == 0) {
                                  if (local_100 == (ushort *)0x0) {
                                    local_108 = local_d0;
LAB_0010b10a:
                                    ppVar23 = tls->key_schedule;
                                    if (ppVar23->num_hashes != 0) {
                                      puVar33 = emitter->buf->base;
                                      sVar42 = emitter->buf->off;
                                      pppVar36 = &ppVar23->hashes[0].ctx;
                                      sVar40 = 0;
                                      do {
                                        (*(*pppVar36)->update)
                                                  (*pppVar36,puVar33 + local_108,sVar42 - local_108)
                                        ;
                                        sVar40 = sVar40 + 1;
                                        pppVar36 = pppVar36 + 2;
                                      } while (sVar40 != ppVar23->num_hashes);
                                    }
                                    if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) !=
                                        0) {
                                      if (ppVar5 != (ptls_key_schedule_t *)0x0) {
                                        __assert_fail("!is_second_flight",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                                  ,0x85f,
                                                  "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                                                  );
                                      }
                                      iVar16 = setup_traffic_protection(tls,1,"c e traffic",1,0);
                                      if ((iVar16 != 0) ||
                                         (iVar16 = push_change_cipher_spec(tls,emitter), iVar16 != 0
                                         )) goto LAB_00109c1d;
                                    }
                                    if ((ppVar5 != (ptls_key_schedule_t *)0x0 ||
                                         local_100 == (ushort *)0x0) ||
                                       (iVar16 = derive_exporter_secret(tls,1), iVar16 == 0)) {
                                      tls->state = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO -
                                                   (local_c8 == (ptls_iovec_t *)0x0);
                                      iVar16 = 0x202;
                                    }
                                  }
                                  else {
                                    sVar42 = emitter->buf->off;
                                    ppVar23 = tls->key_schedule;
                                    algo = ppVar23->hashes[0].algo;
                                    sVar40 = algo->digest_size;
                                    hash_value.len = sVar40;
                                    hash_value.base = algo->empty_digest;
                                    secret.len = sVar40;
                                    secret.base = ppVar23->secret;
                                    iVar16 = hkdf_expand_label(algo,binder_key,sVar40,secret,
                                                               "res binder",hash_value,
                                                               ppVar23->hkdf_label_prefix);
                                    if (iVar16 == 0) {
                                      lVar32 = sVar42 - sVar40;
                                      local_108 = lVar32 - 3;
                                      ppVar23 = tls->key_schedule;
                                      local_118 = emitter->buf->base;
                                      if (ppVar23->num_hashes != 0) {
                                        local_118 = local_118 + local_d0;
                                        sVar42 = local_108 - local_d0;
                                        pppVar36 = &ppVar23->hashes[0].ctx;
                                        sVar40 = 0;
                                        do {
                                          (*(*pppVar36)->update)(*pppVar36,local_118,sVar42);
                                          sVar40 = sVar40 + 1;
                                          pppVar36 = pppVar36 + 2;
                                        } while (sVar40 != ppVar23->num_hashes);
                                        local_118 = emitter->buf->base;
                                        ppVar23 = tls->key_schedule;
                                      }
                                      iVar16 = calc_verify_data(local_118 + lVar32,ppVar23,
                                                                binder_key);
                                      if (iVar16 == 0) goto LAB_0010b10a;
                                    }
                                  }
                                }
                              }
                              else {
                                iVar16 = ptls_buffer_reserve(buf_00,2);
                                if (iVar16 == 0) {
                                  puVar33 = buf_00->base;
                                  sVar40 = buf_00->off;
                                  (puVar33 + sVar40)[0] = '\0';
                                  (puVar33 + sVar40)[1] = '-';
                                  buf_00->off = buf_00->off + 2;
                                  iVar16 = ptls_buffer_reserve(buf_00,2);
                                  if (iVar16 == 0) {
                                    puVar33 = buf_00->base;
                                    sVar40 = buf_00->off;
                                    (puVar33 + sVar40)[0] = '\0';
                                    (puVar33 + sVar40)[1] = '\0';
                                    sVar40 = buf_00->off;
                                    buf_00->off = sVar40 + 2;
                                    iVar16 = ptls_buffer_reserve(buf_00,1);
                                    if (iVar16 == 0) {
                                      buf_00->base[buf_00->off] = '\0';
                                      sVar30 = buf_00->off;
                                      buf_00->off = sVar30 + 1;
                                      if ((tls->ctx->field_0x70 & 1) == 0) {
                                        iVar16 = ptls_buffer_reserve(buf_00,1);
                                        if (iVar16 != 0) goto LAB_00109c1d;
                                        buf_00->base[buf_00->off] = '\0';
                                        buf_00->off = buf_00->off + 1;
                                      }
                                      iVar16 = ptls_buffer_reserve(buf_00,1);
                                      if (iVar16 == 0) {
                                        buf_00->base[buf_00->off] = '\x01';
                                        sVar27 = buf_00->off;
                                        buf_00->off = sVar27 + 1;
                                        buf_00->base[sVar30] = (char)sVar27 - (char)sVar30;
                                        lVar32 = buf_00->off - (sVar40 + 2);
                                        buf_00->base[sVar40] = (uint8_t)((ulong)lVar32 >> 8);
                                        buf_00->base[sVar40 + 1] = (uint8_t)lVar32;
                                        if (local_100 == (ushort *)0x0) goto LAB_0010ade1;
                                        if (((tls->field_18).server.pending_traffic_secret[0x38] & 2
                                            ) == 0 || ppVar5 != (ptls_key_schedule_t *)0x0) {
LAB_0010abcb:
                                          iVar16 = ptls_buffer_reserve(buf_00,2);
                                          if (iVar16 == 0) {
                                            puVar33 = buf_00->base;
                                            sVar40 = buf_00->off;
                                            (puVar33 + sVar40)[0] = '\0';
                                            (puVar33 + sVar40)[1] = ')';
                                            buf_00->off = buf_00->off + 2;
                                            iVar16 = ptls_buffer_reserve(buf_00,2);
                                            if (iVar16 == 0) {
                                              puVar33 = buf_00->base;
                                              sVar40 = buf_00->off;
                                              (puVar33 + sVar40)[0] = '\0';
                                              (puVar33 + sVar40)[1] = '\0';
                                              sVar40 = buf_00->off;
                                              buf_00->off = sVar40 + 2;
                                              iVar16 = ptls_buffer_reserve(buf_00,2);
                                              if (iVar16 == 0) {
                                                puVar33 = buf_00->base;
                                                sVar30 = buf_00->off;
                                                (puVar33 + sVar30)[0] = '\0';
                                                (puVar33 + sVar30)[1] = '\0';
                                                sVar30 = buf_00->off;
                                                buf_00->off = sVar30 + 2;
                                                iVar16 = ptls_buffer_reserve(buf_00,2);
                                                if (iVar16 == 0) {
                                                  puVar33 = buf_00->base;
                                                  sVar27 = buf_00->off;
                                                  (puVar33 + sVar27)[0] = '\0';
                                                  (puVar33 + sVar27)[1] = '\0';
                                                  sVar27 = buf_00->off;
                                                  buf_00->off = sVar27 + 2;
                                                  iVar16 = ptls_buffer__do_pushv
                                                                     (buf_00,resumption_ticket.base,
                                                                      resumption_ticket.len);
                                                  if (iVar16 == 0) {
                                                    lVar32 = buf_00->off - (sVar27 + 2);
                                                    buf_00->base[sVar27] =
                                                         (uint8_t)((ulong)lVar32 >> 8);
                                                    buf_00->base[sVar27 + 1] = (uint8_t)lVar32;
                                                    iVar16 = ptls_buffer_reserve(buf_00,4);
                                                    if (iVar16 == 0) {
                                                      *(uint *)(buf_00->base + buf_00->off) =
                                                           uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8
                                                           | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
                                                      ;
                                                      sVar27 = buf_00->off + 4;
                                                      buf_00->off = sVar27;
                                                      lVar32 = sVar27 - (sVar30 + 2);
                                                      buf_00->base[sVar30] =
                                                           (uint8_t)((ulong)lVar32 >> 8);
                                                      buf_00->base[sVar30 + 1] = (uint8_t)lVar32;
                                                      iVar16 = ptls_buffer_reserve(buf_00,2);
                                                      if (iVar16 == 0) {
                                                        puVar33 = buf_00->base;
                                                        sVar30 = buf_00->off;
                                                        (puVar33 + sVar30)[0] = '\0';
                                                        (puVar33 + sVar30)[1] = '\0';
                                                        sVar30 = buf_00->off;
                                                        buf_00->off = sVar30 + 2;
                                                        iVar16 = ptls_buffer_reserve(buf_00,1);
                                                        if (iVar16 == 0) {
                                                          buf_00->base[buf_00->off] = '\0';
                                                          sVar27 = buf_00->off;
                                                          sVar34 = sVar27 + 1;
                                                          buf_00->off = sVar34;
                                                          iVar16 = ptls_buffer_reserve(buf_00,(tls->
                                                  key_schedule->hashes[0].algo)->digest_size);
                                                  if (iVar16 == 0) {
                                                    sVar31 = buf_00->off +
                                                             (tls->key_schedule->hashes[0].algo)->
                                                             digest_size;
                                                    buf_00->off = sVar31;
                                                    buf_00->base[sVar27] =
                                                         (char)sVar31 - (char)sVar34;
                                                    lVar32 = buf_00->off - (sVar30 + 2);
                                                    buf_00->base[sVar30] =
                                                         (uint8_t)((ulong)lVar32 >> 8);
                                                    buf_00->base[sVar30 + 1] = (uint8_t)lVar32;
                                                    lVar32 = buf_00->off - (sVar40 + 2);
                                                    buf_00->base[sVar40] =
                                                         (uint8_t)((ulong)lVar32 >> 8);
                                                    buf_00->base[sVar40 + 1] = (uint8_t)lVar32;
                                                    goto LAB_0010ade1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                        else {
                                          iVar16 = ptls_buffer_reserve(buf_00,2);
                                          if (iVar16 == 0) {
                                            puVar33 = buf_00->base;
                                            sVar40 = buf_00->off;
                                            (puVar33 + sVar40)[0] = '\0';
                                            (puVar33 + sVar40)[1] = '*';
                                            buf_00->off = buf_00->off + 2;
                                            iVar16 = ptls_buffer_reserve(buf_00,2);
                                            if (iVar16 == 0) {
                                              puVar33 = buf_00->base;
                                              sVar40 = buf_00->off;
                                              (puVar33 + sVar40)[0] = '\0';
                                              (puVar33 + sVar40)[1] = '\0';
                                              sVar40 = buf_00->off;
                                              buf_00->off = sVar40 + 2;
                                              buf_00->base[sVar40] = '\0';
                                              buf_00->base[sVar40 + 1] = '\0';
                                              goto LAB_0010abcb;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          else {
                            iVar16 = ptls_buffer_reserve(buf_00,2);
                            if (iVar16 == 0) {
                              puVar33 = buf_00->base;
                              sVar40 = buf_00->off;
                              (puVar33 + sVar40)[0] = '\0';
                              (puVar33 + sVar40)[1] = '\x14';
                              buf_00->off = buf_00->off + 2;
                              iVar16 = ptls_buffer_reserve(buf_00,2);
                              if (iVar16 == 0) {
                                puVar33 = buf_00->base;
                                sVar40 = buf_00->off;
                                (puVar33 + sVar40)[0] = '\0';
                                (puVar33 + sVar40)[1] = '\0';
                                sVar40 = buf_00->off;
                                buf_00->off = sVar40 + 2;
                                iVar16 = ptls_buffer_reserve(buf_00,1);
                                if (iVar16 == 0) {
                                  buf_00->base[buf_00->off] = '\0';
                                  sVar30 = buf_00->off;
                                  buf_00->off = sVar30 + 1;
                                  iVar16 = ptls_buffer_reserve(buf_00,1);
                                  if (iVar16 == 0) {
                                    buf_00->base[buf_00->off] = '\x02';
                                    sVar27 = buf_00->off;
                                    buf_00->off = sVar27 + 1;
                                    buf_00->base[sVar30] = (char)sVar27 - (char)sVar30;
                                    lVar32 = buf_00->off - (sVar40 + 2);
                                    buf_00->base[sVar40] = (uint8_t)((ulong)lVar32 >> 8);
                                    buf_00->base[sVar40 + 1] = (uint8_t)lVar32;
                                    goto LAB_0010aa78;
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          iVar16 = ptls_buffer_reserve(buf_00,2);
                          if (iVar16 == 0) {
                            puVar33 = buf_00->base;
                            sVar40 = buf_00->off;
                            (puVar33 + sVar40)[0] = '\0';
                            (puVar33 + sVar40)[1] = ',';
                            buf_00->off = buf_00->off + 2;
                            iVar16 = ptls_buffer_reserve(buf_00,2);
                            if (iVar16 == 0) {
                              puVar33 = buf_00->base;
                              sVar40 = buf_00->off;
                              (puVar33 + sVar40)[0] = '\0';
                              (puVar33 + sVar40)[1] = '\0';
                              sVar40 = buf_00->off;
                              buf_00->off = sVar40 + 2;
                              iVar16 = ptls_buffer_reserve(buf_00,2);
                              if (iVar16 == 0) {
                                puVar33 = buf_00->base;
                                sVar30 = buf_00->off;
                                (puVar33 + sVar30)[0] = '\0';
                                (puVar33 + sVar30)[1] = '\0';
                                sVar30 = buf_00->off;
                                buf_00->off = sVar30 + 2;
                                iVar16 = ptls_buffer__do_pushv(buf_00,local_c8->base,local_c8->len);
                                if (iVar16 == 0) {
                                  lVar32 = buf_00->off - (sVar30 + 2);
                                  buf_00->base[sVar30] = (uint8_t)((ulong)lVar32 >> 8);
                                  buf_00->base[sVar30 + 1] = (uint8_t)lVar32;
                                  lVar32 = buf_00->off - (sVar40 + 2);
                                  buf_00->base[sVar40] = (uint8_t)((ulong)lVar32 >> 8);
                                  buf_00->base[sVar40 + 1] = (uint8_t)lVar32;
                                  goto LAB_0010aa6b;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar16 = ptls_buffer_reserve(buf_00,2);
      if (iVar16 == 0) {
        puVar33 = buf_00->base;
        sVar40 = buf_00->off;
        (puVar33 + sVar40)[0] = '\0';
        (puVar33 + sVar40)[1] = '\x1b';
        buf_00->off = buf_00->off + 2;
        iVar16 = ptls_buffer_reserve(buf_00,2);
        if (iVar16 == 0) {
          puVar33 = buf_00->base;
          sVar40 = buf_00->off;
          (puVar33 + sVar40)[0] = '\0';
          (puVar33 + sVar40)[1] = '\0';
          sVar40 = buf_00->off;
          buf_00->off = sVar40 + 2;
          iVar16 = ptls_buffer_reserve(buf_00,1);
          if (iVar16 == 0) {
            buf_00->base[buf_00->off] = '\0';
            sVar30 = buf_00->off;
            sVar27 = sVar30 + 1;
            buf_00->off = sVar27;
            puVar35 = tls->ctx->decompress_certificate->supported_algorithms;
            uVar38 = *puVar35;
            if (uVar38 == 0xffff) {
              __assert_fail("*algo != UINT16_MAX",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                            ,0x80e,
                            "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                           );
            }
            do {
              puVar35 = puVar35 + 1;
              iVar16 = ptls_buffer_reserve(buf_00,2);
              if (iVar16 != 0) goto LAB_00109c1d;
              *(uint16_t *)(buf_00->base + buf_00->off) = uVar38 << 8 | uVar38 >> 8;
              sVar34 = buf_00->off + 2;
              buf_00->off = sVar34;
              uVar38 = *puVar35;
            } while (uVar38 != 0xffff);
            buf_00->base[sVar30] = (char)sVar34 - (char)sVar27;
            lVar32 = buf_00->off - (sVar40 + 2);
            buf_00->base[sVar40] = (uint8_t)((ulong)lVar32 >> 8);
            buf_00->base[sVar40 + 1] = (uint8_t)lVar32;
            goto LAB_0010a6cb;
          }
        }
      }
    }
    goto LAB_00109c1d;
  }
  if (tls->esni == (ptls_esni_secret_t *)0x0) {
    iVar16 = ptls_buffer_reserve(buf_00,2);
    if (iVar16 == 0) {
      puVar33 = buf_00->base;
      sVar40 = buf_00->off;
      (puVar33 + sVar40)[0] = '\0';
      (puVar33 + sVar40)[1] = '\0';
      buf_00->off = buf_00->off + 2;
      iVar16 = ptls_buffer_reserve(buf_00,2);
      if (iVar16 == 0) {
        puVar33 = buf_00->base;
        sVar40 = buf_00->off;
        (puVar33 + sVar40)[0] = '\0';
        (puVar33 + sVar40)[1] = '\0';
        sVar40 = buf_00->off;
        buf_00->off = sVar40 + 2;
        iVar16 = emit_server_name_extension(buf_00,tls->server_name);
        if (iVar16 == 0) {
          lVar32 = buf_00->off - (sVar40 + 2);
          buf_00->base[sVar40] = (uint8_t)((ulong)lVar32 >> 8);
          buf_00->base[sVar40 + 1] = (uint8_t)lVar32;
          goto LAB_0010a41e;
        }
      }
    }
    goto LAB_00109c1d;
  }
  if (server_name == (char *)0x0) {
LAB_0010af63:
    iVar16 = ptls_buffer_reserve(buf_00,2);
    if (iVar16 == 0) {
      puVar33 = buf_00->base;
      sVar40 = buf_00->off;
      (puVar33 + sVar40)[0] = 0xff;
      (puVar33 + sVar40)[1] = 0xce;
      buf_00->off = buf_00->off + 2;
      iVar16 = ptls_buffer_reserve(buf_00,2);
      if (iVar16 == 0) {
        puVar33 = buf_00->base;
        sVar40 = buf_00->off;
        (puVar33 + sVar40)[0] = '\0';
        (puVar33 + sVar40)[1] = '\0';
        sVar40 = buf_00->off;
        buf_00->off = sVar40 + 2;
        esni_keys.len = local_e0;
        esni_keys.base = (uint8_t *)tls->server_name;
        iVar16 = emit_esni_extension(tls->esni,buf_00,esni_keys,server_name_00,(size_t)in_R9,
                                     in_stack_fffffffffffffec8);
        if (iVar16 == 0) {
          lVar32 = buf_00->off - (sVar40 + 2);
          buf_00->base[sVar40] = (uint8_t)((ulong)lVar32 >> 8);
          buf_00->base[sVar40 + 1] = (uint8_t)lVar32;
          goto LAB_0010a42a;
        }
      }
    }
    goto LAB_00109c1d;
  }
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 == 0) {
    puVar33 = buf_00->base;
    sVar40 = buf_00->off;
    (puVar33 + sVar40)[0] = '\0';
    (puVar33 + sVar40)[1] = '\0';
    buf_00->off = buf_00->off + 2;
    iVar16 = ptls_buffer_reserve(buf_00,2);
    if (iVar16 == 0) {
      puVar33 = buf_00->base;
      sVar40 = buf_00->off;
      (puVar33 + sVar40)[0] = '\0';
      (puVar33 + sVar40)[1] = '\0';
      sVar40 = buf_00->off;
      buf_00->off = sVar40 + 2;
      iVar16 = emit_server_name_extension(buf_00,server_name);
      if (iVar16 == 0) {
        lVar32 = buf_00->off - (sVar40 + 2);
        buf_00->base[sVar40] = (uint8_t)((ulong)lVar32 >> 8);
        buf_00->base[sVar40 + 1] = (uint8_t)lVar32;
        goto LAB_0010af63;
      }
    }
  }
LAB_00109c22:
  free(server_name);
LAB_00109c2a:
  (*ptls_clear_memory)(binder_key,0x40);
  return iVar16;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    ptls_iovec_t resumption_secret = {NULL}, resumption_ticket;
    char *published_sni = NULL;
    uint32_t obfuscated_ticket_age = 0;
    size_t msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret, is_second_flight = tls->key_schedule != NULL,
             send_sni = tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name);

    if (properties != NULL) {
        /* try to use ESNI */
        if (!is_second_flight && send_sni && properties->client.esni_keys.base != NULL) {
            if ((ret = client_setup_esni(tls->ctx, &tls->esni, properties->client.esni_keys, &published_sni, tls->client_random)) !=
                0) {
                goto Exit;
            }
            if (tls->ctx->update_esni_key != NULL) {
                if ((ret = tls->ctx->update_esni_key->cb(tls->ctx->update_esni_key, tls, tls->esni->secret,
                                                         tls->esni->client.cipher->hash, tls->esni->esni_contents_hash)) != 0)
                    goto Exit;
            }
        }
        /* setup resumption-related data. If successful, resumption_secret becomes a non-zero value. */
        if (properties->client.session_ticket.base != NULL) {
            ptls_key_exchange_algorithm_t *key_share = NULL;
            ptls_cipher_suite_t *cipher_suite = NULL;
            uint32_t max_early_data_size;
            if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &resumption_secret, &obfuscated_ticket_age,
                                             &resumption_ticket, &max_early_data_size, properties->client.session_ticket.base,
                                             properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
                tls->client.offered_psk = 1;
                /* key-share selected by HRR should not be overridden */
                if (tls->key_share == NULL)
                    tls->key_share = key_share;
                tls->cipher_suite = cipher_suite;
                if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                    tls->client.using_early_data = 1;
                    *properties->client.max_early_data_size = max_early_data_size;
                }
            } else {
                resumption_secret = ptls_iovec_init(NULL, 0);
            }
        }
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    if (!is_second_flight) {
        tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ctx->hkdf_label_prefix__obsolete);
        if ((ret = key_schedule_extract(tls->key_schedule, resumption_secret)) != 0)
            goto Exit;
    }

    msghash_off = emitter->buf->off + emitter->record_header_length;
    ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        ptls_buffer_t *sendbuf = emitter->buf;
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, tls->client_random, sizeof(tls->client_random));
        /* lecagy_session_id */
        ptls_buffer_push_block(
            sendbuf, 1, { ptls_buffer_pushv(sendbuf, tls->client.legacy_session_id.base, tls->client.legacy_session_id.len); });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = tls->ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            struct {
                size_t off;
                size_t len;
            } key_share_client_hello;
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                key_share_client_hello.off = sendbuf->off;
                ptls_buffer_push_block(sendbuf, 2, {
                    if (tls->key_share != NULL) {
                        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
                            goto Exit;
                        if ((ret = push_key_share_entry(sendbuf, tls->key_share->id, tls->client.key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    }
                });
                key_share_client_hello.len = sendbuf->off - key_share_client_hello.off;
            });
            if (send_sni) {
                if (tls->esni != NULL) {
                    if (published_sni != NULL) {
                        buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                            if ((ret = emit_server_name_extension(sendbuf, published_sni)) != 0)
                                goto Exit;
                        });
                    }
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME, {
                        if ((ret = emit_esni_extension(tls->esni, sendbuf, properties->client.esni_keys, tls->server_name,
                                                       key_share_client_hello.off, key_share_client_hello.len)) != 0)
                            goto Exit;
                    });
                } else {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                        if ((ret = emit_server_name_extension(sendbuf, tls->server_name)) != 0)
                            goto Exit;
                    });
                }
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (tls->ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = tls->ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(tls->ctx->verify_certificate, sendbuf)) != 0)
                    goto Exit;
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                ptls_key_exchange_algorithm_t **algo = tls->ctx->key_exchanges;
                ptls_buffer_push_block(sendbuf, 2, {
                    for (; *algo != NULL; ++algo)
                        ptls_buffer_push16(sendbuf, (*algo)->id);
                });
            });
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if (tls->ctx->use_raw_public_keys) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE, {
                    ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, PTLS_CERTIFICATE_TYPE_RAW_PUBLIC_KEY); });
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (tls->ctx->save_ticket != NULL || resumption_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!tls->ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (resumption_secret.base != NULL) {
                if (tls->client.using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2,
                                               { ptls_buffer_pushv(sendbuf, resumption_ticket.base, resumption_ticket.len); });
                        ptls_buffer_push32(sendbuf, obfuscated_ticket_age);
                    });
                    /* allocate space for PSK binder. the space is filled at the bottom of the function */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                                goto Exit;
                            sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
                        });
                    });
                });
            }
        });
    });

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (resumption_secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, "res binder")) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off);

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
            goto Exit;
    }
    if (resumption_secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    if (published_sni != NULL) {
        free(published_sni);
    }
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}